

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LToken.cpp
# Opt level: O1

void __thiscall LToken::LToken(LToken *this,LNodeType type,string *str)

{
  (this->token)._M_dataplus._M_p = (pointer)&(this->token).field_2;
  (this->token)._M_string_length = 0;
  (this->token).field_2._M_local_buf[0] = '\0';
  this->type = type;
  std::__cxx11::string::operator=((string *)&this->token,(string *)str);
  return;
}

Assistant:

LToken::LToken(LNodeType type, std::string str) {
    this->type = type;
    this->token = std::move(str);
}